

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  IfcElement *this_00;
  
  this_00 = (IfcElement *)
            &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78 = 0x8a0a60;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x60 = 0x8a0ba0;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x8a0a88;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x110 = 0x8a0ab0;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x8a0ad8;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x8a0b00;
  this[-1].MeshWidth.ptr = 4.46972494237209e-317;
  this[-1].LongitudinalBarNominalDiameter = 4.46974470499792e-317;
  this[-1].LongitudinalBarCrossSectionArea = 4.46976446762376e-317;
  if ((undefined1 *)this[-1].LongitudinalBarSpacing != &this[-1].field_0x1f0) {
    operator_delete((undefined1 *)this[-1].LongitudinalBarSpacing,*(long *)&this[-1].field_0x1f0 + 1
                   );
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008a0828);
  operator_delete(this_00,0x208);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}